

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O1

void ctemplate_htmlparser::htmlparser_reset(htmlparser_ctx *ctx)

{
  if (ctx != (htmlparser_ctx *)0x0) {
    statemachine_reset(ctx->statemachine);
    ctx->in_js = 0;
    ctx->tag[0] = '\0';
    ctx->attr[0] = '\0';
    ctx->value[0] = '\0';
    jsparser_reset(ctx->jsparser);
    ctx->statemachine->current_state = 0;
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x2b2,"void ctemplate_htmlparser::htmlparser_reset(htmlparser_ctx *)");
}

Assistant:

void htmlparser_reset(htmlparser_ctx *ctx)
{
    assert(ctx != NULL);
    htmlparser_reset_mode(ctx, HTMLPARSER_MODE_HTML);
}